

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

int ptls_fusion_aesgcm_decrypt
              (ptls_fusion_aesgcm_context_t *_ctx,void *output,void *input,size_t inlen,__m128i ctr,
              void *_aad,size_t aadlen,void *tag)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  bool bVar13;
  __m128i *palVar14;
  uint *puVar15;
  __m128i *palVar16;
  __m128i *extraout_RDX;
  longlong extraout_RDX_01;
  undefined8 in_XMM0_Qa;
  undefined1 auVar17 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar18 [64];
  __m128i v;
  __m128i alVar19;
  __m128i X;
  __m128i ek0_00;
  __m128i calctag;
  __m128i k;
  __m128i k_2;
  __m128i k_1;
  size_t aesi;
  ptls_fusion_aesgcm_context128 *ppStack_b58;
  int state;
  size_t src_aeslen;
  size_t src_ghashlen;
  size_t nondata_aes_cnt;
  __m128i *dst;
  __m128i *aad;
  __m128i *src_aes;
  __m128i *src_ghash;
  size_t gdata_cnt;
  __m128i *gdata;
  ptls_fusion_aesgcm_ghash_precompute128 *ghash_precompute;
  __m128i ac;
  __m128i gdatabuf [6];
  ptls_fusion_gfmul_state128 gstate;
  __m128i bits5;
  __m128i bits4;
  __m128i bits3;
  __m128i bits2;
  __m128i bits1;
  __m128i bits0;
  __m128i ek0;
  ptls_fusion_aesgcm_context128 *ctx;
  size_t aadlen_local;
  void *_aad_local;
  __m128i ctr_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  ptls_fusion_aesgcm_context_t *_ctx_local;
  ulong local_4e8;
  ulong uStack_4e0;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_4a8;
  ulong uStack_4a0;
  ulong local_488;
  ulong uStack_480;
  ulong local_468;
  ulong uStack_460;
  ulong local_448;
  ulong uStack_440;
  __m128i *extraout_RDX_00;
  
  stack0xfffffffffffff5f8 = ZEXT816(0);
  stack0xfffffffffffff5d8 = ZEXT816(0);
  stack0xfffffffffffff5c8 = ZEXT816(0);
  stack0xfffffffffffff5b8 = ZEXT816(0);
  stack0xfffffffffffff5a8 = ZEXT816(0);
  stack0xfffffffffffff598 = ZEXT816(0);
  stack0xfffffffffffff568 = SUB3216(ZEXT832(0),0) << 0x20;
  ctx._0_4_ = (int)ctr[1];
  ctr_local[1]._0_4_ = (int)inlen;
  palVar16 = (__m128i *)0x0;
  auVar1 = vpinsrd_avx(ZEXT416((uint)((int)ctr_local[1] << 3)),0,1);
  auVar1 = vpinsrd_avx(auVar1,(int)ctx << 3,2);
  auVar1 = vpinsrd_avx(auVar1,0,3);
  auVar10[8] = '\a';
  auVar10[9] = '\x06';
  auVar10[10] = '\x05';
  auVar10[0xb] = '\x04';
  auVar10[0xc] = '\x03';
  auVar10[0xd] = '\x02';
  auVar10[0xe] = '\x01';
  auVar10[0xf] = '\0';
  auVar10[0] = '\x0f';
  auVar10[1] = '\x0e';
  auVar10[2] = '\r';
  auVar10[3] = '\f';
  auVar10[4] = '\v';
  auVar10[5] = '\n';
  auVar10[6] = '\t';
  auVar10[7] = '\b';
  auVar1 = vpshufb_avx(auVar1,auVar10);
  gdata = (__m128i *)
          ((long)&_ctx[1].ecb.keys + (inlen + 0xf >> 4) * 0x20 + (ctr[1] + 0xfU >> 4) * 0x20 + 0x20)
  ;
  auVar11._8_8_ = in_XMM0_Qb;
  auVar11._0_8_ = in_XMM0_Qa;
  __aad_local = vpaddq_avx(auVar11,ZEXT816((ulong)1));
  auVar9[8] = '\a';
  auVar9[9] = '\x06';
  auVar9[10] = '\x05';
  auVar9[0xb] = '\x04';
  auVar9[0xc] = '\x03';
  auVar9[0xd] = '\x02';
  auVar9[0xe] = '\x01';
  auVar9[0xf] = '\0';
  auVar9[0] = '\x0f';
  auVar9[1] = '\x0e';
  auVar9[2] = '\r';
  auVar9[3] = '\f';
  auVar9[4] = '\v';
  auVar9[5] = '\n';
  auVar9[6] = '\t';
  auVar9[7] = '\b';
  auVar17 = vpshufb_avx(__aad_local,auVar9);
  auVar17 = auVar17 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0];
  src_ghashlen = 1;
  bVar13 = true;
  bVar12 = true;
  ppStack_b58 = (ptls_fusion_aesgcm_context128 *)inlen;
  src_aeslen = inlen;
  nondata_aes_cnt = (size_t)output;
  dst = (__m128i *)ctr[0];
  aad = (__m128i *)input;
  src_aes = (__m128i *)input;
  unique0x10002abe = auVar17;
  ctx = (ptls_fusion_aesgcm_context128 *)ctr[1];
LAB_00130209:
  do {
    auVar18 = ZEXT1664(auVar17);
    alVar19[0] = (ptls_fusion_aesgcm_context128 *)output;
    if (ctx == (ptls_fusion_aesgcm_context128 *)0x0) {
      if (src_aeslen < 0x60) {
        src_ghash = (__m128i *)0x0;
LAB_001303b6:
        gdata_cnt = (size_t)(ac + 1);
        for (; alVar19[0] = (ptls_fusion_aesgcm_context128 *)output, src_ghash < (__m128i *)0x6;
            src_ghash = (__m128i *)((long)*src_ghash + 1)) {
          if (src_aeslen < 0x10) {
            if (src_aeslen != 0) {
              auVar17 = auVar18._0_16_;
              output = (void *)src_aeslen;
              alVar19 = loadn128(src_aes,src_aeslen);
              palVar16 = alVar19[1];
              *(undefined1 (*) [16])(gdatabuf[(long)((long)src_ghash[-1] + 0xf)] + 1) = auVar17;
              src_aes = (__m128i *)((long)*src_aes + src_aeslen);
              src_aeslen = 0;
              src_ghash = (__m128i *)((long)*src_ghash + 1);
            }
            alVar19[0] = (ptls_fusion_aesgcm_context128 *)output;
            if ((src_ghash < (__m128i *)0x6) && (bVar13)) {
              ghash_precompute = auVar1._0_8_;
              ac[0] = auVar1._8_8_;
              gdatabuf[(long)((long)src_ghash[-1] + 0xf)][1] = (longlong)ghash_precompute;
              gdatabuf[(long)src_ghash][0] = ac[0];
              bVar13 = false;
              src_ghash = (__m128i *)((long)*src_ghash + 1);
            }
            break;
          }
          auVar18 = ZEXT1664((undefined1  [16])*src_aes);
          *(__m128i *)(gdatabuf[(long)((long)src_ghash[-1] + 0xf)] + 1) = *src_aes;
          src_aeslen = src_aeslen - 0x10;
          src_aes = src_aes + 1;
        }
      }
      else {
        gdata_cnt = (size_t)src_aes;
        src_ghash = (__m128i *)0x6;
        src_aes = src_aes + 6;
        src_aeslen = src_aeslen - 0x60;
      }
    }
    else {
      gdata_cnt = (size_t)(ac + 1);
      for (src_ghash = (__m128i *)0x0; src_ghash < (__m128i *)0x6;
          src_ghash = (__m128i *)((long)*src_ghash + 1)) {
        if (ctx < (ptls_fusion_aesgcm_context128 *)0x10) {
          if (ctx != (ptls_fusion_aesgcm_context128 *)0x0) {
            auVar18 = ZEXT1664(auVar18._0_16_);
            output = ctx;
            alVar19 = loadn128(dst,(size_t)ctx);
            palVar16 = alVar19[1];
            *(undefined1 (*) [16])(gdatabuf[(long)((long)src_ghash[-1] + 0xf)] + 1) = auVar18._0_16_
            ;
            ctx = (ptls_fusion_aesgcm_context128 *)0x0;
            src_ghashlen = src_ghashlen + 1;
            src_ghash = (__m128i *)((long)*src_ghash + 1);
          }
          goto LAB_001303b6;
        }
        auVar18 = ZEXT1664((undefined1  [16])*dst);
        *(__m128i *)(gdatabuf[(long)((long)src_ghash[-1] + 0xf)] + 1) = *dst;
        ctx = (ptls_fusion_aesgcm_context128 *)&ctx[-1].super.field_0x210;
        src_ghashlen = src_ghashlen + 1;
        dst = dst + 1;
      }
    }
    if (src_ghashlen == 0) {
      __aad_local = vpaddq_avx(__aad_local,ZEXT816((ulong)1));
      auVar8[8] = '\a';
      auVar8[9] = '\x06';
      auVar8[10] = '\x05';
      auVar8[0xb] = '\x04';
      auVar8[0xc] = '\x03';
      auVar8[0xd] = '\x02';
      auVar8[0xe] = '\x01';
      auVar8[0xf] = '\0';
      auVar8[0] = '\x0f';
      auVar8[1] = '\x0e';
      auVar8[2] = '\r';
      auVar8[3] = '\f';
      auVar8[4] = '\v';
      auVar8[5] = '\n';
      auVar8[6] = '\t';
      auVar8[7] = '\b';
      auVar17 = vpshufb_avx(__aad_local,auVar8);
      local_448 = auVar17._0_8_;
      uStack_440 = auVar17._8_8_;
      bits0[0] = uStack_440 ^ (_ctx->ecb).keys.m128[0][1];
      bits1[1] = local_448 ^ (_ctx->ecb).keys.m128[0][0];
switchD_00130547_caseD_1:
      __aad_local = vpaddq_avx(__aad_local,ZEXT816((ulong)1));
      auVar7[8] = '\a';
      auVar7[9] = '\x06';
      auVar7[10] = '\x05';
      auVar7[0xb] = '\x04';
      auVar7[0xc] = '\x03';
      auVar7[0xd] = '\x02';
      auVar7[0xe] = '\x01';
      auVar7[0xf] = '\0';
      auVar7[0] = '\x0f';
      auVar7[1] = '\x0e';
      auVar7[2] = '\r';
      auVar7[3] = '\f';
      auVar7[4] = '\v';
      auVar7[5] = '\n';
      auVar7[6] = '\t';
      auVar7[7] = '\b';
      auVar17 = vpshufb_avx(__aad_local,auVar7);
      local_468 = auVar17._0_8_;
      uStack_460 = auVar17._8_8_;
      bits1[0] = uStack_460 ^ (_ctx->ecb).keys.m128[0][1];
      bits2[1] = local_468 ^ (_ctx->ecb).keys.m128[0][0];
      goto switchD_00130547_caseD_2;
    }
    switch(src_ghashlen) {
    case 1:
      goto switchD_00130547_caseD_1;
    case 2:
switchD_00130547_caseD_2:
      __aad_local = vpaddq_avx(__aad_local,ZEXT816((ulong)1));
      auVar6[8] = '\a';
      auVar6[9] = '\x06';
      auVar6[10] = '\x05';
      auVar6[0xb] = '\x04';
      auVar6[0xc] = '\x03';
      auVar6[0xd] = '\x02';
      auVar6[0xe] = '\x01';
      auVar6[0xf] = '\0';
      auVar6[0] = '\x0f';
      auVar6[1] = '\x0e';
      auVar6[2] = '\r';
      auVar6[3] = '\f';
      auVar6[4] = '\v';
      auVar6[5] = '\n';
      auVar6[6] = '\t';
      auVar6[7] = '\b';
      auVar17 = vpshufb_avx(__aad_local,auVar6);
      local_488 = auVar17._0_8_;
      uStack_480 = auVar17._8_8_;
      bits2[0] = uStack_480 ^ (_ctx->ecb).keys.m128[0][1];
      bits3[1] = local_488 ^ (_ctx->ecb).keys.m128[0][0];
    case 3:
      __aad_local = vpaddq_avx(__aad_local,ZEXT816((ulong)1));
      auVar5[8] = '\a';
      auVar5[9] = '\x06';
      auVar5[10] = '\x05';
      auVar5[0xb] = '\x04';
      auVar5[0xc] = '\x03';
      auVar5[0xd] = '\x02';
      auVar5[0xe] = '\x01';
      auVar5[0xf] = '\0';
      auVar5[0] = '\x0f';
      auVar5[1] = '\x0e';
      auVar5[2] = '\r';
      auVar5[3] = '\f';
      auVar5[4] = '\v';
      auVar5[5] = '\n';
      auVar5[6] = '\t';
      auVar5[7] = '\b';
      auVar17 = vpshufb_avx(__aad_local,auVar5);
      local_4a8 = auVar17._0_8_;
      uStack_4a0 = auVar17._8_8_;
      bits3[0] = uStack_4a0 ^ (_ctx->ecb).keys.m128[0][1];
      bits4[1] = local_4a8 ^ (_ctx->ecb).keys.m128[0][0];
    case 4:
      __aad_local = vpaddq_avx(__aad_local,ZEXT816((ulong)1));
      auVar4[8] = '\a';
      auVar4[9] = '\x06';
      auVar4[10] = '\x05';
      auVar4[0xb] = '\x04';
      auVar4[0xc] = '\x03';
      auVar4[0xd] = '\x02';
      auVar4[0xe] = '\x01';
      auVar4[0xf] = '\0';
      auVar4[0] = '\x0f';
      auVar4[1] = '\x0e';
      auVar4[2] = '\r';
      auVar4[3] = '\f';
      auVar4[4] = '\v';
      auVar4[5] = '\n';
      auVar4[6] = '\t';
      auVar4[7] = '\b';
      auVar17 = vpshufb_avx(__aad_local,auVar4);
      local_4c8 = auVar17._0_8_;
      uStack_4c0 = auVar17._8_8_;
      bits4[0] = uStack_4c0 ^ (_ctx->ecb).keys.m128[0][1];
      bits5[1] = local_4c8 ^ (_ctx->ecb).keys.m128[0][0];
    case 5:
      __aad_local = vpaddq_avx(__aad_local,ZEXT816((ulong)1));
      auVar3[8] = '\a';
      auVar3[9] = '\x06';
      auVar3[10] = '\x05';
      auVar3[0xb] = '\x04';
      auVar3[0xc] = '\x03';
      auVar3[0xd] = '\x02';
      auVar3[0xe] = '\x01';
      auVar3[0xf] = '\0';
      auVar3[0] = '\x0f';
      auVar3[1] = '\x0e';
      auVar3[2] = '\r';
      auVar3[3] = '\f';
      auVar3[4] = '\v';
      auVar3[5] = '\n';
      auVar3[6] = '\t';
      auVar3[7] = '\b';
      auVar17 = vpshufb_avx(__aad_local,auVar3);
      local_4e8 = auVar17._0_8_;
      uStack_4e0 = auVar17._8_8_;
      bits5[0] = uStack_4e0 ^ (_ctx->ecb).keys.m128[0][1];
      gstate.mid[1] = local_4e8 ^ (_ctx->ecb).keys.m128[0][0];
    }
    for (k_1[1] = 1; (ulong)k_1[1] <= src_ghash; k_1[1] = k_1[1] + 1) {
      palVar14 = (_ctx->ecb).keys.m128 + k_1[1];
      register0x00001200 = aesenc(stack0xfffffffffffff5e8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff5d8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff5c8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff5b8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff5a8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff598,(undefined1  [16])*palVar14);
      gdata_cnt = gdata_cnt + 0x10;
      X[0] = (ptls_fusion_aesgcm_context128 *)(gdata + -2);
      X[1] = (longlong)palVar16;
      alVar19[0] = X[0];
      gfmul_nextstep128((ptls_fusion_gfmul_state128 *)(gdatabuf[5] + 1),X,
                        (ptls_fusion_aesgcm_ghash_precompute128 *)gdata_cnt);
      palVar16 = extraout_RDX;
      gdata = (__m128i *)X[0];
    }
    for (; (ulong)k_1[1] < (ulong)(_ctx->ecb).rounds; k_1[1] = k_1[1] + 1) {
      palVar14 = (_ctx->ecb).keys.m128 + k_1[1];
      register0x00001200 = aesenc(stack0xfffffffffffff5e8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff5d8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff5c8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff5b8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff5a8,(undefined1  [16])*palVar14);
      register0x00001200 = aesenc(stack0xfffffffffffff598,(undefined1  [16])*palVar14);
    }
    palVar14 = (_ctx->ecb).keys.m128 + k_1[1];
    register0x00001200 = aesenclast(stack0xfffffffffffff5e8,(undefined1  [16])*palVar14);
    register0x00001200 = aesenclast(stack0xfffffffffffff5d8,(undefined1  [16])*palVar14);
    register0x00001200 = aesenclast(stack0xfffffffffffff5c8,(undefined1  [16])*palVar14);
    register0x00001200 = aesenclast(stack0xfffffffffffff5b8,(undefined1  [16])*palVar14);
    register0x00001200 = aesenclast(stack0xfffffffffffff5a8,(undefined1  [16])*palVar14);
    register0x00001200 = aesenclast(stack0xfffffffffffff598,(undefined1  [16])*palVar14);
    output = alVar19[0];
    if (src_ghashlen == 0 && (ptls_fusion_aesgcm_context128 *)0x5f < ppStack_b58) {
      uVar2 = (*aad)[1];
      *(longlong *)nondata_aes_cnt = (*aad)[0] ^ bits1[1];
      *(ulong *)(nondata_aes_cnt + 8) = uVar2 ^ bits0[0];
      uVar2 = aad[1][1];
      *(longlong *)(nondata_aes_cnt + 0x10) = aad[1][0] ^ bits2[1];
      *(ulong *)(nondata_aes_cnt + 0x18) = uVar2 ^ bits1[0];
      uVar2 = aad[2][1];
      *(longlong *)(nondata_aes_cnt + 0x20) = aad[2][0] ^ bits3[1];
      *(ulong *)(nondata_aes_cnt + 0x28) = uVar2 ^ bits2[0];
      uVar2 = aad[3][1];
      *(longlong *)(nondata_aes_cnt + 0x30) = aad[3][0] ^ bits4[1];
      *(ulong *)(nondata_aes_cnt + 0x38) = uVar2 ^ bits3[0];
      uVar2 = aad[4][1];
      *(longlong *)(nondata_aes_cnt + 0x40) = aad[4][0] ^ bits5[1];
      *(ulong *)(nondata_aes_cnt + 0x48) = uVar2 ^ bits4[0];
      auVar17._8_8_ = aad[5][1] ^ bits5[0];
      auVar17._0_8_ = aad[5][0] ^ gstate.mid[1];
      *(undefined1 (*) [16])(nondata_aes_cnt + 0x50) = auVar17;
      nondata_aes_cnt = nondata_aes_cnt + 0x60;
      aad = aad + 6;
      ppStack_b58 = (ptls_fusion_aesgcm_context128 *)((long)&ppStack_b58[-1].super.ecb.keys + 0x1c0)
      ;
      goto LAB_00130209;
    }
    auVar17 = register0x00001200;
    if (bVar12) {
      bVar12 = false;
      auVar17 = register0x00001200;
      unique0x10002ace = register0x00001200;
    }
    puVar15 = &switchD_001311cb::switchdataD_0014d9f8;
    switch(src_ghashlen) {
    case 0:
      if (ppStack_b58 < (ptls_fusion_aesgcm_context128 *)0x11) goto LAB_001316c0;
      palVar16 = aad + 1;
      uVar2 = (*aad)[1];
      *(longlong *)nondata_aes_cnt = (*aad)[0] ^ bits1[1];
      *(ulong *)(nondata_aes_cnt + 8) = uVar2 ^ bits0[0];
      ppStack_b58 = (ptls_fusion_aesgcm_context128 *)&ppStack_b58[-1].super.field_0x210;
      puVar15 = (uint *)aad;
      nondata_aes_cnt = nondata_aes_cnt + 0x10;
      aad = palVar16;
      break;
    case 1:
      break;
    case 2:
      goto switchD_001311cb_caseD_2;
    case 3:
      goto switchD_001311cb_caseD_3;
    case 4:
      goto switchD_001311cb_caseD_4;
    case 5:
      goto switchD_001311cb_caseD_5;
    default:
      goto switchD_001311cb_default;
    }
    if (ppStack_b58 < (ptls_fusion_aesgcm_context128 *)0x11) {
      bits1[1] = bits2[1];
      bits0[0] = bits1[0];
      goto LAB_001316c0;
    }
    palVar16 = aad + 1;
    uVar2 = (*aad)[1];
    *(longlong *)nondata_aes_cnt = (*aad)[0] ^ bits2[1];
    *(ulong *)(nondata_aes_cnt + 8) = uVar2 ^ bits1[0];
    ppStack_b58 = (ptls_fusion_aesgcm_context128 *)&ppStack_b58[-1].super.field_0x210;
    puVar15 = (uint *)aad;
    nondata_aes_cnt = nondata_aes_cnt + 0x10;
    aad = palVar16;
switchD_001311cb_caseD_2:
    if (ppStack_b58 < (ptls_fusion_aesgcm_context128 *)0x11) {
      bits1[1] = bits3[1];
      bits0[0] = bits2[0];
      goto LAB_001316c0;
    }
    palVar16 = aad + 1;
    uVar2 = (*aad)[1];
    *(longlong *)nondata_aes_cnt = (*aad)[0] ^ bits3[1];
    *(ulong *)(nondata_aes_cnt + 8) = uVar2 ^ bits2[0];
    ppStack_b58 = (ptls_fusion_aesgcm_context128 *)&ppStack_b58[-1].super.field_0x210;
    puVar15 = (uint *)aad;
    nondata_aes_cnt = nondata_aes_cnt + 0x10;
    aad = palVar16;
switchD_001311cb_caseD_3:
    if (ppStack_b58 < (ptls_fusion_aesgcm_context128 *)0x11) {
      bits1[1] = bits4[1];
      bits0[0] = bits3[0];
      goto LAB_001316c0;
    }
    palVar16 = aad + 1;
    uVar2 = (*aad)[1];
    *(longlong *)nondata_aes_cnt = (*aad)[0] ^ bits4[1];
    *(ulong *)(nondata_aes_cnt + 8) = uVar2 ^ bits3[0];
    ppStack_b58 = (ptls_fusion_aesgcm_context128 *)&ppStack_b58[-1].super.field_0x210;
    puVar15 = (uint *)aad;
    nondata_aes_cnt = nondata_aes_cnt + 0x10;
    aad = palVar16;
switchD_001311cb_caseD_4:
    if (ppStack_b58 < (ptls_fusion_aesgcm_context128 *)0x11) {
      bits1[1] = bits5[1];
      bits0[0] = bits4[0];
      goto LAB_001316c0;
    }
    palVar16 = aad + 1;
    uVar2 = (*aad)[1];
    *(longlong *)nondata_aes_cnt = (*aad)[0] ^ bits5[1];
    *(ulong *)(nondata_aes_cnt + 8) = uVar2 ^ bits4[0];
    ppStack_b58 = (ptls_fusion_aesgcm_context128 *)&ppStack_b58[-1].super.field_0x210;
    puVar15 = (uint *)aad;
    nondata_aes_cnt = nondata_aes_cnt + 0x10;
    aad = palVar16;
switchD_001311cb_caseD_5:
    if (ppStack_b58 < (ptls_fusion_aesgcm_context128 *)0x11) {
      bits1[1] = gstate.mid[1];
      bits0[0] = bits5[0];
LAB_001316c0:
      if (ppStack_b58 == (ptls_fusion_aesgcm_context128 *)0x10) {
        uVar2 = (*aad)[1];
        *(longlong *)nondata_aes_cnt = (*aad)[0] ^ bits1[1];
        *(ulong *)(nondata_aes_cnt + 8) = uVar2 ^ bits0[0];
      }
      else if (ppStack_b58 != (ptls_fusion_aesgcm_context128 *)0x0) {
        alVar19 = loadn128(aad,(size_t)ppStack_b58);
        v[0] = alVar19[1];
        v[1] = (longlong)puVar15;
        storen128((void *)nondata_aes_cnt,(size_t)ppStack_b58,v);
        palVar16 = extraout_RDX_00;
        alVar19[0] = ppStack_b58;
      }
      if (bVar12) {
        __assert_fail("(state & STATE_IS_FIRST_RUN) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/fusion.c"
                      ,0x33d,
                      "int ptls_fusion_aesgcm_decrypt(ptls_fusion_aesgcm_context_t *, void *, const void *, size_t, __m128i, const void *, size_t, const void *)"
                     );
      }
      if (bVar13) {
        if ((ptls_fusion_aesgcm_context_t *)(gdata + -2) != _ctx + 1) {
          __assert_fail("ghash_precompute - 1 == ctx->ghash",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/fusion.c"
                        ,0x341,
                        "int ptls_fusion_aesgcm_decrypt(ptls_fusion_aesgcm_context_t *, void *, const void *, size_t, __m128i, const void *, size_t, const void *)"
                       );
        }
        alVar19[0] = (ptls_fusion_aesgcm_context128 *)(gdata + -2);
        alVar19[1] = (longlong)palVar16;
        gfmul_nextstep128((ptls_fusion_gfmul_state128 *)(gdatabuf[5] + 1),alVar19,
                          (ptls_fusion_aesgcm_ghash_precompute128 *)(_ctx + 1));
      }
      gfmul_reduce128((ptls_fusion_gfmul_state128 *)(gdatabuf[5] + 1));
      ek0_00[1] = extraout_RDX_01;
      ek0_00[0] = (longlong)alVar19[0];
      gfmul_get_tag128((ptls_fusion_gfmul_state128 *)(gdatabuf[5] + 1),ek0_00);
      auVar1._8_8_ = ek0[0];
      auVar1._0_8_ = bits0[1];
      auVar1 = vpcmpeqb_avx(auVar1,*_aad);
      return (int)((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) == 0xffff);
    }
    palVar16 = aad + 1;
    auVar17._8_8_ = (*aad)[1] ^ bits5[0];
    auVar17._0_8_ = (*aad)[0] ^ gstate.mid[1];
    *(undefined1 (*) [16])nondata_aes_cnt = auVar17;
    ppStack_b58 = (ptls_fusion_aesgcm_context128 *)&ppStack_b58[-1].super.field_0x210;
    nondata_aes_cnt = nondata_aes_cnt + 0x10;
    aad = palVar16;
switchD_001311cb_default:
    src_ghashlen = 0;
  } while( true );
}

Assistant:

int ptls_fusion_aesgcm_decrypt(ptls_fusion_aesgcm_context_t *_ctx, void *output, const void *input, size_t inlen, __m128i ctr,
                               const void *_aad, size_t aadlen, const void *tag)
{
    struct ptls_fusion_aesgcm_context128 *ctx = (void *)_ctx;
    __m128i ek0 = _mm_setzero_si128(), bits0, bits1 = _mm_setzero_si128(), bits2 = _mm_setzero_si128(), bits3 = _mm_setzero_si128(),
            bits4 = _mm_setzero_si128(), bits5 = _mm_setzero_si128();
    struct ptls_fusion_gfmul_state128 gstate = {0};
    __m128i gdatabuf[6];
    __m128i ac = _mm_shuffle_epi8(_mm_set_epi32(0, (int)aadlen * 8, 0, (int)inlen * 8), byteswap128);
    struct ptls_fusion_aesgcm_ghash_precompute128 *ghash_precompute = ctx->ghash + (aadlen + 15) / 16 + (inlen + 15) / 16 + 1;

    const __m128i *gdata; // points to the elements fed into GHASH
    size_t gdata_cnt;

    const __m128i *src_ghash = input, *src_aes = input, *aad = _aad;
    __m128i *dst = output;
    size_t nondata_aes_cnt = 0, src_ghashlen = inlen, src_aeslen = inlen;

    /* schedule ek0 and suppkey */
    ctr = _mm_add_epi64(ctr, one8);
    bits0 = _mm_xor_si128(_mm_shuffle_epi8(ctr, byteswap128), ctx->super.ecb.keys.m128[0]);
    ++nondata_aes_cnt;

#define STATE_IS_FIRST_RUN 0x1
#define STATE_GHASH_HAS_MORE 0x2
    int state = STATE_IS_FIRST_RUN | STATE_GHASH_HAS_MORE;

    /* the main loop */
    while (1) {

        /* setup gdata */
        if (PTLS_UNLIKELY(aadlen != 0)) {
            gdata = gdatabuf;
            gdata_cnt = 0;
            while (gdata_cnt < 6) {
                if (aadlen < 16) {
                    if (aadlen != 0) {
                        gdatabuf[gdata_cnt++] = loadn128(aad, aadlen);
                        aadlen = 0;
                        ++nondata_aes_cnt;
                    }
                    goto GdataFillSrc;
                }
                gdatabuf[gdata_cnt++] = _mm_loadu_si128(aad++);
                aadlen -= 16;
                ++nondata_aes_cnt;
            }
        } else if (PTLS_LIKELY(src_ghashlen >= 6 * 16)) {
            gdata = src_ghash;
            gdata_cnt = 6;
            src_ghash += 6;
            src_ghashlen -= 6 * 16;
        } else {
            gdata = gdatabuf;
            gdata_cnt = 0;
        GdataFillSrc:
            while (gdata_cnt < 6) {
                if (src_ghashlen < 16) {
                    if (src_ghashlen != 0) {
                        gdatabuf[gdata_cnt++] = loadn128(src_ghash, src_ghashlen);
                        src_ghash = (__m128i *)((uint8_t *)src_ghash + src_ghashlen);
                        src_ghashlen = 0;
                    }
                    if (gdata_cnt < 6 && (state & STATE_GHASH_HAS_MORE) != 0) {
                        gdatabuf[gdata_cnt++] = ac;
                        state &= ~STATE_GHASH_HAS_MORE;
                    }
                    break;
                }
                gdatabuf[gdata_cnt++] = _mm_loadu_si128(src_ghash++);
                src_ghashlen -= 16;
            }
        }

        /* setup aes bits */
        if (PTLS_LIKELY(nondata_aes_cnt == 0))
            goto InitAllBits;
        switch (nondata_aes_cnt) {
#define INIT_BITS(n, keys)                                                                                                         \
    case n:                                                                                                                        \
        ctr = _mm_add_epi64(ctr, one8);                                                                                            \
        bits##n = _mm_xor_si128(_mm_shuffle_epi8(ctr, byteswap128), keys.m128[0]);
        InitAllBits:
            INIT_BITS(0, ctx->super.ecb.keys);
            INIT_BITS(1, ctx->super.ecb.keys);
            INIT_BITS(2, ctx->super.ecb.keys);
            INIT_BITS(3, ctx->super.ecb.keys);
            INIT_BITS(4, ctx->super.ecb.keys);
            INIT_BITS(5, ctx->super.ecb.keys);
#undef INIT_BITS
        }

        { /* run aes and ghash */
#define AESECB6_UPDATE(i)                                                                                                          \
    do {                                                                                                                           \
        __m128i k = ctx->super.ecb.keys.m128[i];                                                                                   \
        bits0 = _mm_aesenc_si128(bits0, k);                                                                                        \
        bits1 = _mm_aesenc_si128(bits1, k);                                                                                        \
        bits2 = _mm_aesenc_si128(bits2, k);                                                                                        \
        bits3 = _mm_aesenc_si128(bits3, k);                                                                                        \
        bits4 = _mm_aesenc_si128(bits4, k);                                                                                        \
        bits5 = _mm_aesenc_si128(bits5, k);                                                                                        \
    } while (0)

            size_t aesi;
            for (aesi = 1; aesi <= gdata_cnt; ++aesi) {
                AESECB6_UPDATE(aesi);
                gfmul_nextstep128(&gstate, _mm_loadu_si128(gdata++), --ghash_precompute);
            }
            for (; aesi < ctx->super.ecb.rounds; ++aesi)
                AESECB6_UPDATE(aesi);
            __m128i k = ctx->super.ecb.keys.m128[aesi];
            bits0 = _mm_aesenclast_si128(bits0, k);
            bits1 = _mm_aesenclast_si128(bits1, k);
            bits2 = _mm_aesenclast_si128(bits2, k);
            bits3 = _mm_aesenclast_si128(bits3, k);
            bits4 = _mm_aesenclast_si128(bits4, k);
            bits5 = _mm_aesenclast_si128(bits5, k);

#undef AESECB6_UPDATE
        }

        /* apply aes bits */
        if (PTLS_LIKELY(nondata_aes_cnt == 0 && src_aeslen >= 6 * 16)) {
#define APPLY(i) _mm_storeu_si128(dst + i, _mm_xor_si128(_mm_loadu_si128(src_aes + i), bits##i))
            APPLY(0);
            APPLY(1);
            APPLY(2);
            APPLY(3);
            APPLY(4);
            APPLY(5);
#undef APPLY
            dst += 6;
            src_aes += 6;
            src_aeslen -= 6 * 16;
        } else {
            if ((state & STATE_IS_FIRST_RUN) != 0) {
                ek0 = bits0;
                state &= ~STATE_IS_FIRST_RUN;
            }
            switch (nondata_aes_cnt) {
#define APPLY(i)                                                                                                                   \
    case i:                                                                                                                        \
        if (PTLS_LIKELY(src_aeslen > 16)) {                                                                                        \
            _mm_storeu_si128(dst++, _mm_xor_si128(_mm_loadu_si128(src_aes++), bits##i));                                           \
            src_aeslen -= 16;                                                                                                      \
        } else {                                                                                                                   \
            bits0 = bits##i;                                                                                                       \
            goto Finish;                                                                                                           \
        }
                APPLY(0);
                APPLY(1);
                APPLY(2);
                APPLY(3);
                APPLY(4);
                APPLY(5);
#undef APPLY
            }
            nondata_aes_cnt = 0;
        }
    }

Finish:
    if (src_aeslen == 16) {
        _mm_storeu_si128(dst, _mm_xor_si128(_mm_loadu_si128(src_aes), bits0));
    } else if (src_aeslen != 0) {
        storen128(dst, src_aeslen, _mm_xor_si128(loadn128(src_aes, src_aeslen), bits0));
    }

    assert((state & STATE_IS_FIRST_RUN) == 0);

    /* the only case where AES operation is complete and GHASH is not is when the application of AC is remaining */
    if ((state & STATE_GHASH_HAS_MORE) != 0) {
        assert(ghash_precompute - 1 == ctx->ghash);
        gfmul_nextstep128(&gstate, ac, --ghash_precompute);
    }

    gfmul_reduce128(&gstate);
    __m128i calctag = gfmul_get_tag128(&gstate, ek0);

    return _mm_movemask_epi8(_mm_cmpeq_epi8(calctag, _mm_loadu_si128(tag))) == 0xffff;

#undef STATE_IS_FIRST_RUN
#undef STATE_GHASH_HAS_MORE
}